

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct8_w4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  uint uVar38;
  undefined4 uVar39;
  int32_t *piVar40;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  int iVar41;
  int iVar54;
  int iVar56;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar55;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d0_4;
  __m128i c0_4;
  __m128i b0_4;
  __m128i a0_4;
  __m128i v0_4;
  __m128i u0_4;
  __m128i t0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d0_3;
  __m128i c0_3;
  __m128i b0_3;
  __m128i a0_3;
  __m128i v0_3;
  __m128i u0_3;
  __m128i t0_3;
  __m128i d0_2;
  __m128i c0_2;
  __m128i b0_2;
  __m128i a0_2;
  __m128i v0_2;
  __m128i u0_2;
  __m128i t0_2;
  __m128i d0_1;
  __m128i c0_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i v0_1;
  __m128i u0_1;
  __m128i t0_1;
  __m128i d0;
  __m128i c0;
  __m128i b0;
  __m128i a0;
  __m128i v0;
  __m128i u0;
  __m128i t0;
  __m128i x [8];
  __m128i cospi_m32_p32;
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p40_p24;
  __m128i cospi_p24_m40;
  __m128i cospi_p08_p56;
  __m128i cospi_p56_m08;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined2 local_8e8;
  undefined2 uStack_8e6;
  undefined2 uStack_8e4;
  undefined2 uStack_8e2;
  undefined2 local_8d8;
  undefined2 uStack_8d6;
  undefined2 uStack_8d4;
  undefined2 uStack_8d2;
  undefined2 local_8c8;
  undefined2 uStack_8c6;
  undefined2 uStack_8c4;
  undefined2 uStack_8c2;
  undefined2 local_8b8;
  undefined2 uStack_8b6;
  undefined2 uStack_8b4;
  undefined2 uStack_8b2;
  undefined2 local_8a8;
  undefined2 uStack_8a6;
  undefined2 uStack_8a4;
  undefined2 uStack_8a2;
  undefined2 local_898;
  undefined2 uStack_896;
  undefined2 uStack_894;
  undefined2 uStack_892;
  undefined2 local_888;
  undefined2 uStack_886;
  undefined2 uStack_884;
  undefined2 uStack_882;
  undefined2 local_878;
  undefined2 uStack_876;
  undefined2 uStack_874;
  undefined2 uStack_872;
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 local_858;
  undefined2 uStack_856;
  undefined2 uStack_854;
  undefined2 uStack_852;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  
  piVar40 = cospi_arr(0xc);
  iVar37 = (uint)*(ushort *)(piVar40 + 0x38) + piVar40[8] * -0x10000;
  auVar15._4_4_ = iVar37;
  auVar15._0_4_ = iVar37;
  auVar15._12_4_ = iVar37;
  auVar15._8_4_ = iVar37;
  uVar38 = (uint)*(ushort *)(piVar40 + 8) | piVar40[0x38] << 0x10;
  auVar13._4_4_ = uVar38;
  auVar13._0_4_ = uVar38;
  auVar13._12_4_ = uVar38;
  auVar13._8_4_ = uVar38;
  iVar37 = (uint)*(ushort *)(piVar40 + 0x18) + piVar40[0x28] * -0x10000;
  auVar11._4_4_ = iVar37;
  auVar11._0_4_ = iVar37;
  auVar11._12_4_ = iVar37;
  auVar11._8_4_ = iVar37;
  uVar38 = (uint)*(ushort *)(piVar40 + 0x28) | piVar40[0x18] << 0x10;
  auVar46._4_4_ = uVar38;
  auVar46._0_4_ = uVar38;
  auVar46._12_4_ = uVar38;
  auVar46._8_4_ = uVar38;
  uVar39 = CONCAT22((short)piVar40[0x20],(short)piVar40[0x20]);
  iVar37 = (piVar40[0x20] & 0xffffU) + piVar40[0x20] * -0x10000;
  auVar48._4_4_ = iVar37;
  auVar48._0_4_ = iVar37;
  auVar48._12_4_ = iVar37;
  auVar48._8_4_ = iVar37;
  iVar37 = (uint)*(ushort *)(piVar40 + 0x30) + piVar40[0x10] * -0x10000;
  auVar50._4_4_ = iVar37;
  auVar50._0_4_ = iVar37;
  auVar50._12_4_ = iVar37;
  auVar50._8_4_ = iVar37;
  uVar38 = (uint)*(ushort *)(piVar40 + 0x10) | piVar40[0x30] << 0x10;
  auVar51._4_4_ = uVar38;
  auVar51._0_4_ = uVar38;
  auVar51._12_4_ = uVar38;
  auVar51._8_4_ = uVar38;
  uVar38 = -piVar40[0x20] & 0xffffU | piVar40[0x20] << 0x10;
  auVar53._4_4_ = uVar38;
  auVar53._0_4_ = uVar38;
  auVar53._12_4_ = uVar38;
  auVar53._8_4_ = uVar38;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[8];
  uVar3 = in_RDI[4];
  uVar4 = in_RDI[0xc];
  uVar5 = in_RDI[2];
  uVar6 = in_RDI[10];
  uVar7 = in_RDI[6];
  uVar8 = in_RDI[0xe];
  local_858 = (undefined2)uVar5;
  uStack_856 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_854 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_852 = (undefined2)((ulong)uVar5 >> 0x30);
  local_868 = (undefined2)uVar8;
  uStack_866 = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_864 = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_862 = (undefined2)((ulong)uVar8 >> 0x30);
  auVar16._2_2_ = local_868;
  auVar16._0_2_ = local_858;
  auVar16._4_2_ = uStack_856;
  auVar16._6_2_ = uStack_866;
  auVar16._10_2_ = uStack_864;
  auVar16._8_2_ = uStack_854;
  auVar16._12_2_ = uStack_852;
  auVar16._14_2_ = uStack_862;
  auVar42 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = local_868;
  auVar14._0_2_ = local_858;
  auVar14._4_2_ = uStack_856;
  auVar14._6_2_ = uStack_866;
  auVar14._10_2_ = uStack_864;
  auVar14._8_2_ = uStack_854;
  auVar14._12_2_ = uStack_852;
  auVar14._14_2_ = uStack_862;
  auVar43 = pmaddwd(auVar14,auVar13);
  local_5d8 = auVar42._0_4_;
  iStack_5d4 = auVar42._4_4_;
  iStack_5d0 = auVar42._8_4_;
  iStack_5cc = auVar42._12_4_;
  local_5f8 = auVar43._0_4_;
  iStack_5f4 = auVar43._4_4_;
  iStack_5f0 = auVar43._8_4_;
  iStack_5ec = auVar43._12_4_;
  auVar42 = ZEXT416(0xc);
  iVar37 = local_5d8 + 0x800 >> auVar42;
  iVar54 = iStack_5d4 + 0x800 >> auVar42;
  iVar56 = iStack_5d0 + 0x800 >> auVar42;
  iVar58 = iStack_5cc + 0x800 >> auVar42;
  auVar42 = ZEXT416(0xc);
  iVar41 = local_5f8 + 0x800 >> auVar42;
  iVar55 = iStack_5f4 + 0x800 >> auVar42;
  iVar57 = iStack_5f0 + 0x800 >> auVar42;
  iVar59 = iStack_5ec + 0x800 >> auVar42;
  auVar36._4_4_ = iVar54;
  auVar36._0_4_ = iVar37;
  auVar36._12_4_ = iVar58;
  auVar36._8_4_ = iVar56;
  auVar35._4_4_ = iVar54;
  auVar35._0_4_ = iVar37;
  auVar35._12_4_ = iVar58;
  auVar35._8_4_ = iVar56;
  auVar42 = packssdw(auVar36,auVar35);
  auVar34._4_4_ = iVar55;
  auVar34._0_4_ = iVar41;
  auVar34._12_4_ = iVar59;
  auVar34._8_4_ = iVar57;
  auVar33._4_4_ = iVar55;
  auVar33._0_4_ = iVar41;
  auVar33._12_4_ = iVar59;
  auVar33._8_4_ = iVar57;
  auVar43 = packssdw(auVar34,auVar33);
  local_878 = (undefined2)uVar6;
  uStack_876 = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_874 = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_872 = (undefined2)((ulong)uVar6 >> 0x30);
  local_888 = (undefined2)uVar7;
  uStack_886 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_884 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_882 = (undefined2)((ulong)uVar7 >> 0x30);
  auVar12._2_2_ = local_888;
  auVar12._0_2_ = local_878;
  auVar12._4_2_ = uStack_876;
  auVar12._6_2_ = uStack_886;
  auVar12._10_2_ = uStack_884;
  auVar12._8_2_ = uStack_874;
  auVar12._12_2_ = uStack_872;
  auVar12._14_2_ = uStack_882;
  auVar44 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = local_888;
  auVar10._0_2_ = local_878;
  auVar10._4_2_ = uStack_876;
  auVar10._6_2_ = uStack_886;
  auVar10._10_2_ = uStack_884;
  auVar10._8_2_ = uStack_874;
  auVar10._12_2_ = uStack_872;
  auVar10._14_2_ = uStack_882;
  auVar45 = pmaddwd(auVar10,auVar46);
  local_618 = auVar44._0_4_;
  iStack_614 = auVar44._4_4_;
  iStack_610 = auVar44._8_4_;
  iStack_60c = auVar44._12_4_;
  local_638 = auVar45._0_4_;
  iStack_634 = auVar45._4_4_;
  iStack_630 = auVar45._8_4_;
  iStack_62c = auVar45._12_4_;
  auVar44 = ZEXT416(0xc);
  iVar37 = local_618 + 0x800 >> auVar44;
  iVar54 = iStack_614 + 0x800 >> auVar44;
  iVar56 = iStack_610 + 0x800 >> auVar44;
  iVar58 = iStack_60c + 0x800 >> auVar44;
  auVar44 = ZEXT416(0xc);
  iVar41 = local_638 + 0x800 >> auVar44;
  iVar55 = iStack_634 + 0x800 >> auVar44;
  iVar57 = iStack_630 + 0x800 >> auVar44;
  iVar59 = iStack_62c + 0x800 >> auVar44;
  auVar32._4_4_ = iVar54;
  auVar32._0_4_ = iVar37;
  auVar32._12_4_ = iVar58;
  auVar32._8_4_ = iVar56;
  auVar31._4_4_ = iVar54;
  auVar31._0_4_ = iVar37;
  auVar31._12_4_ = iVar58;
  auVar31._8_4_ = iVar56;
  auVar44 = packssdw(auVar32,auVar31);
  auVar30._4_4_ = iVar55;
  auVar30._0_4_ = iVar41;
  auVar30._12_4_ = iVar59;
  auVar30._8_4_ = iVar57;
  auVar29._4_4_ = iVar55;
  auVar29._0_4_ = iVar41;
  auVar29._12_4_ = iVar59;
  auVar29._8_4_ = iVar57;
  auVar46 = packssdw(auVar30,auVar29);
  local_898 = (undefined2)uVar1;
  uStack_896 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_894 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_892 = (undefined2)((ulong)uVar1 >> 0x30);
  local_8a8 = (undefined2)uVar2;
  uStack_8a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_8a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_8a2 = (undefined2)((ulong)uVar2 >> 0x30);
  auVar9._2_2_ = local_8a8;
  auVar9._0_2_ = local_898;
  auVar9._4_2_ = uStack_896;
  auVar9._6_2_ = uStack_8a6;
  auVar9._10_2_ = uStack_8a4;
  auVar9._8_2_ = uStack_894;
  auVar9._12_2_ = uStack_892;
  auVar9._14_2_ = uStack_8a2;
  auVar52._8_8_ = CONCAT44(uVar39,uVar39);
  auVar52._0_8_ = CONCAT44(uVar39,uVar39);
  auVar45 = pmaddwd(auVar9,auVar52);
  auVar49._2_2_ = local_8a8;
  auVar49._0_2_ = local_898;
  auVar49._4_2_ = uStack_896;
  auVar49._6_2_ = uStack_8a6;
  auVar49._10_2_ = uStack_8a4;
  auVar49._8_2_ = uStack_894;
  auVar49._12_2_ = uStack_892;
  auVar49._14_2_ = uStack_8a2;
  auVar47 = pmaddwd(auVar49,auVar48);
  local_658 = auVar45._0_4_;
  iStack_654 = auVar45._4_4_;
  iStack_650 = auVar45._8_4_;
  iStack_64c = auVar45._12_4_;
  local_678 = auVar47._0_4_;
  iStack_674 = auVar47._4_4_;
  iStack_670 = auVar47._8_4_;
  iStack_66c = auVar47._12_4_;
  auVar45 = ZEXT416(0xc);
  iVar37 = local_658 + 0x800 >> auVar45;
  iVar54 = iStack_654 + 0x800 >> auVar45;
  iVar56 = iStack_650 + 0x800 >> auVar45;
  iVar58 = iStack_64c + 0x800 >> auVar45;
  auVar45 = ZEXT416(0xc);
  iVar41 = local_678 + 0x800 >> auVar45;
  iVar55 = iStack_674 + 0x800 >> auVar45;
  iVar57 = iStack_670 + 0x800 >> auVar45;
  iVar59 = iStack_66c + 0x800 >> auVar45;
  auVar28._4_4_ = iVar54;
  auVar28._0_4_ = iVar37;
  auVar28._12_4_ = iVar58;
  auVar28._8_4_ = iVar56;
  auVar27._4_4_ = iVar54;
  auVar27._0_4_ = iVar37;
  auVar27._12_4_ = iVar58;
  auVar27._8_4_ = iVar56;
  auVar48 = packssdw(auVar28,auVar27);
  auVar26._4_4_ = iVar55;
  auVar26._0_4_ = iVar41;
  auVar26._12_4_ = iVar59;
  auVar26._8_4_ = iVar57;
  auVar25._4_4_ = iVar55;
  auVar25._0_4_ = iVar41;
  auVar25._12_4_ = iVar59;
  auVar25._8_4_ = iVar57;
  auVar49 = packssdw(auVar26,auVar25);
  local_8b8 = (undefined2)uVar3;
  uStack_8b6 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_8b4 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_8b2 = (undefined2)((ulong)uVar3 >> 0x30);
  local_8c8 = (undefined2)uVar4;
  uStack_8c6 = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_8c4 = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_8c2 = (undefined2)((ulong)uVar4 >> 0x30);
  auVar47._2_2_ = local_8c8;
  auVar47._0_2_ = local_8b8;
  auVar47._4_2_ = uStack_8b6;
  auVar47._6_2_ = uStack_8c6;
  auVar47._10_2_ = uStack_8c4;
  auVar47._8_2_ = uStack_8b4;
  auVar47._12_2_ = uStack_8b2;
  auVar47._14_2_ = uStack_8c2;
  auVar50 = pmaddwd(auVar47,auVar50);
  auVar45._2_2_ = local_8c8;
  auVar45._0_2_ = local_8b8;
  auVar45._4_2_ = uStack_8b6;
  auVar45._6_2_ = uStack_8c6;
  auVar45._10_2_ = uStack_8c4;
  auVar45._8_2_ = uStack_8b4;
  auVar45._12_2_ = uStack_8b2;
  auVar45._14_2_ = uStack_8c2;
  auVar51 = pmaddwd(auVar45,auVar51);
  local_698 = auVar50._0_4_;
  iStack_694 = auVar50._4_4_;
  iStack_690 = auVar50._8_4_;
  iStack_68c = auVar50._12_4_;
  local_6b8 = auVar51._0_4_;
  iStack_6b4 = auVar51._4_4_;
  iStack_6b0 = auVar51._8_4_;
  iStack_6ac = auVar51._12_4_;
  auVar51 = ZEXT416(0xc);
  iVar37 = local_698 + 0x800 >> auVar51;
  iVar54 = iStack_694 + 0x800 >> auVar51;
  iVar56 = iStack_690 + 0x800 >> auVar51;
  iVar58 = iStack_68c + 0x800 >> auVar51;
  auVar51 = ZEXT416(0xc);
  iVar41 = local_6b8 + 0x800 >> auVar51;
  iVar55 = iStack_6b4 + 0x800 >> auVar51;
  iVar57 = iStack_6b0 + 0x800 >> auVar51;
  iVar59 = iStack_6ac + 0x800 >> auVar51;
  auVar24._4_4_ = iVar54;
  auVar24._0_4_ = iVar37;
  auVar24._12_4_ = iVar58;
  auVar24._8_4_ = iVar56;
  auVar23._4_4_ = iVar54;
  auVar23._0_4_ = iVar37;
  auVar23._12_4_ = iVar58;
  auVar23._8_4_ = iVar56;
  auVar51 = packssdw(auVar24,auVar23);
  auVar22._4_4_ = iVar55;
  auVar22._0_4_ = iVar41;
  auVar22._12_4_ = iVar59;
  auVar22._8_4_ = iVar57;
  auVar21._4_4_ = iVar55;
  auVar21._0_4_ = iVar41;
  auVar21._12_4_ = iVar59;
  auVar21._8_4_ = iVar57;
  auVar45 = packssdw(auVar22,auVar21);
  auVar50 = paddsw(auVar42,auVar44);
  auVar42 = psubsw(auVar42,auVar44);
  auVar44 = psubsw(auVar43,auVar46);
  auVar47 = paddsw(auVar43,auVar46);
  auVar52 = paddsw(auVar48,auVar45);
  auVar45 = psubsw(auVar48,auVar45);
  auVar48 = paddsw(auVar49,auVar51);
  auVar51 = psubsw(auVar49,auVar51);
  local_8d8 = auVar42._0_2_;
  uStack_8d6 = auVar42._2_2_;
  uStack_8d4 = auVar42._4_2_;
  uStack_8d2 = auVar42._6_2_;
  local_8e8 = auVar44._0_2_;
  uStack_8e6 = auVar44._2_2_;
  uStack_8e4 = auVar44._4_2_;
  uStack_8e2 = auVar44._6_2_;
  auVar44._2_2_ = local_8e8;
  auVar44._0_2_ = local_8d8;
  auVar44._4_2_ = uStack_8d6;
  auVar44._6_2_ = uStack_8e6;
  auVar44._10_2_ = uStack_8e4;
  auVar44._8_2_ = uStack_8d4;
  auVar44._12_2_ = uStack_8d2;
  auVar44._14_2_ = uStack_8e2;
  auVar53 = pmaddwd(auVar44,auVar53);
  auVar43._2_2_ = local_8e8;
  auVar43._0_2_ = local_8d8;
  auVar43._4_2_ = uStack_8d6;
  auVar43._6_2_ = uStack_8e6;
  auVar43._10_2_ = uStack_8e4;
  auVar43._8_2_ = uStack_8d4;
  auVar43._12_2_ = uStack_8d2;
  auVar43._14_2_ = uStack_8e2;
  auVar42._8_8_ = CONCAT44(uVar39,uVar39);
  auVar42._0_8_ = CONCAT44(uVar39,uVar39);
  auVar42 = pmaddwd(auVar43,auVar42);
  local_6d8 = auVar53._0_4_;
  iStack_6d4 = auVar53._4_4_;
  iStack_6d0 = auVar53._8_4_;
  iStack_6cc = auVar53._12_4_;
  local_6f8 = auVar42._0_4_;
  iStack_6f4 = auVar42._4_4_;
  iStack_6f0 = auVar42._8_4_;
  iStack_6ec = auVar42._12_4_;
  auVar42 = ZEXT416(0xc);
  iVar37 = local_6d8 + 0x800 >> auVar42;
  iVar54 = iStack_6d4 + 0x800 >> auVar42;
  iVar56 = iStack_6d0 + 0x800 >> auVar42;
  iVar58 = iStack_6cc + 0x800 >> auVar42;
  auVar42 = ZEXT416(0xc);
  iVar41 = local_6f8 + 0x800 >> auVar42;
  iVar55 = iStack_6f4 + 0x800 >> auVar42;
  iVar57 = iStack_6f0 + 0x800 >> auVar42;
  iVar59 = iStack_6ec + 0x800 >> auVar42;
  auVar20._4_4_ = iVar54;
  auVar20._0_4_ = iVar37;
  auVar20._12_4_ = iVar58;
  auVar20._8_4_ = iVar56;
  auVar19._4_4_ = iVar54;
  auVar19._0_4_ = iVar37;
  auVar19._12_4_ = iVar58;
  auVar19._8_4_ = iVar56;
  auVar42 = packssdw(auVar20,auVar19);
  auVar18._4_4_ = iVar55;
  auVar18._0_4_ = iVar41;
  auVar18._12_4_ = iVar59;
  auVar18._8_4_ = iVar57;
  auVar17._4_4_ = iVar55;
  auVar17._0_4_ = iVar41;
  auVar17._12_4_ = iVar59;
  auVar17._8_4_ = iVar57;
  auVar43 = packssdw(auVar18,auVar17);
  auVar53 = paddsw(auVar52,auVar47);
  *in_RSI = auVar53;
  auVar53 = psubsw(auVar52,auVar47);
  in_RSI[7] = auVar53;
  auVar53 = paddsw(auVar48,auVar43);
  in_RSI[1] = auVar53;
  auVar43 = psubsw(auVar48,auVar43);
  in_RSI[6] = auVar43;
  auVar43 = paddsw(auVar51,auVar42);
  in_RSI[2] = auVar43;
  auVar42 = psubsw(auVar51,auVar42);
  in_RSI[5] = auVar42;
  auVar42 = paddsw(auVar45,auVar50);
  in_RSI[3] = auVar42;
  auVar42 = psubsw(auVar45,auVar50);
  in_RSI[4] = auVar42;
  return;
}

Assistant:

static void idct8_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[0];
  x[1] = input[4];
  x[2] = input[2];
  x[3] = input[6];
  x[4] = input[1];
  x[5] = input[5];
  x[6] = input[3];
  x[7] = input[7];

  // stage 2
  btf_16_4p_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_4p_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);

  // stage 3
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);

  // stage 4
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);

  // stage 5
  btf_16_adds_subs_out_sse2(output[0], output[7], x[0], x[7]);
  btf_16_adds_subs_out_sse2(output[1], output[6], x[1], x[6]);
  btf_16_adds_subs_out_sse2(output[2], output[5], x[2], x[5]);
  btf_16_adds_subs_out_sse2(output[3], output[4], x[3], x[4]);
}